

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

err_t InternalRender(ebml_master *Element,stream *Output,bool_t bForceWithoutMandatory,
                    bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  long lVar1;
  err_t eVar2;
  err_t Err;
  filepos_t ItemRendered;
  ebml_element *i;
  filepos_t *Rendered_local;
  bool_t bStack_30;
  int ForProfile_local;
  bool_t bWithDefault_local;
  bool_t bForceWithoutMandatory_local;
  stream *Output_local;
  ebml_master *Element_local;
  
  ItemRendered = (filepos_t)(Element->Base).Base.Children;
  i = (ebml_element *)Rendered;
  Rendered_local._4_4_ = ForProfile;
  bStack_30 = bWithDefault;
  bWithDefault_local = bForceWithoutMandatory;
  bForceWithoutMandatory_local = (bool_t)Output;
  Output_local = (stream *)Element;
  do {
    if (ItemRendered == 0) {
      return 0;
    }
    if (bStack_30 == 0) {
      if (ItemRendered == 0) {
        __assert_fail("(const void*)(i)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0x1c5,
                      "err_t InternalRender(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
      lVar1 = (**(code **)(*(long *)(ItemRendered + 8) + 0x88))(ItemRendered);
      if (lVar1 == 0) goto LAB_00109deb;
    }
    else {
LAB_00109deb:
      eVar2 = EBML_ElementRender((ebml_element *)ItemRendered,(stream *)bForceWithoutMandatory_local
                                 ,bStack_30,0,bWithDefault_local,Rendered_local._4_4_,&Err);
      if (eVar2 != 0) {
        return eVar2;
      }
      *(err_t *)&(i->Base).Base = Err + *(long *)&(i->Base).Base;
    }
    if (ItemRendered == *(long *)(ItemRendered + 0x28)) {
      __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1c3,
                    "err_t InternalRender(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    ItemRendered = *(filepos_t *)(ItemRendered + 0x28);
  } while( true );
}

Assistant:

static err_t InternalRender(ebml_master *Element, struct stream *Output, bool_t bForceWithoutMandatory, bool_t bWithDefault, int ForProfile, filepos_t *Rendered)
{
    ebml_element *i;
    filepos_t ItemRendered;
    err_t Err = ERR_NONE;
    for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
    {
		if (!bWithDefault && EBML_ElementIsDefaultValue(i))
			continue;
		Err = EBML_ElementRender(i,Output, bWithDefault, 0, bForceWithoutMandatory, ForProfile, &ItemRendered);
        if (Err!=ERR_NONE)
            return Err;
        *Rendered += ItemRendered;
	}
    return Err;
}